

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::serializeContactManifolds(cbtCollisionWorld *this,cbtSerializer *serializer)

{
  cbtPersistentManifold *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  
  uVar3 = (**(code **)(*(long *)serializer + 0x68))(serializer);
  if ((uVar3 & 8) != 0) {
    uVar1 = (*this->m_dispatcher1->_vptr_cbtDispatcher[9])();
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        iVar2 = (*this->m_dispatcher1->_vptr_cbtDispatcher[0xb])();
        this_00 = *(cbtPersistentManifold **)(CONCAT44(extraout_var,iVar2) + uVar3 * 8);
        if (this_00->m_cachedPoints != 0) {
          iVar2 = cbtPersistentManifold::calculateSerializeBufferSize(this_00);
          lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,(long)iVar2,1);
          pcVar5 = cbtPersistentManifold::serialize
                             (this_00,this_00,*(void **)(lVar4 + 8),serializer);
          (**(code **)(*(long *)serializer + 0x28))(serializer,lVar4,pcVar5,0x544e4f43,this_00);
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return;
}

Assistant:

void cbtCollisionWorld::serializeContactManifolds(cbtSerializer* serializer)
{
	if (serializer->getSerializationFlags() & BT_SERIALIZE_CONTACT_MANIFOLDS)
	{
		int numManifolds = getDispatcher()->getNumManifolds();
		for (int i = 0; i < numManifolds; i++)
		{
			const cbtPersistentManifold* manifold = getDispatcher()->getInternalManifoldPointer()[i];
			//don't serialize empty manifolds, they just take space
			//(may have to do it anyway if it destroys determinism)
			if (manifold->getNumContacts() == 0)
				continue;

			cbtChunk* chunk = serializer->allocate(manifold->calculateSerializeBufferSize(), 1);
			const char* structType = manifold->serialize(manifold, chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk, structType, BT_CONTACTMANIFOLD_CODE, (void*)manifold);
		}
	}
}